

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderHealthAndAmmo(CHud *this,CNetObj_Character *pCharacter)

{
  int iVar1;
  int iVar2;
  IGraphics *pIVar3;
  IClient *pIVar4;
  long in_RSI;
  long in_FS_OFFSET;
  int h;
  float NinjaProgress;
  int Max;
  int i;
  float y;
  float x;
  CQuadItem Array [10];
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  CDataWeaponspec *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  CDataSprite *this_00;
  CDataSprite *pSpr;
  CDataSprite *this_01;
  uint local_138;
  uint local_12c;
  char *local_10c;
  CDataSpriteset *local_104;
  char *local_fc;
  CDataSpriteset *local_f4;
  char *local_ec;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float fStack_d0;
  char *local_cc;
  CDataSpriteset *local_c4;
  char *local_bc;
  CDataSpriteset *local_b4;
  int local_ac;
  CDataSprite local_a8 [5];
  char *local_8;
  
  local_8 = *(char **)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    pSpr = (CDataSprite *)&stack0xfffffffffffffff8;
    this_01 = local_a8;
    do {
      this_00 = this_01;
      IGraphics::CQuadItem::CQuadItem((CQuadItem *)this_00);
      this_01 = (CDataSprite *)&this_00->m_X;
    } while (this_01 != pSpr);
    pIVar3 = CComponent::Graphics((CComponent *)0x1683d6);
    local_ac = g_pData->m_aImages[1].m_Id.m_Id;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])();
    pIVar3 = CComponent::Graphics((CComponent *)0x16840b);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])();
    pIVar3 = CComponent::Graphics((CComponent *)0x16841e);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
    pIVar3 = CComponent::Graphics((CComponent *)0x168434);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
    if (*(int *)(in_RSI + 0x48) == 5) {
      in_stack_fffffffffffffea0 = (g_pData->m_Weapons).m_Ninja.m_Duration;
      pIVar4 = CComponent::Client((CComponent *)0x16847e);
      iVar1 = IClient::GameTickSpeed(pIVar4);
      iVar1 = in_stack_fffffffffffffea0 * iVar1;
      in_stack_fffffffffffffea4 = *(int *)(in_RSI + 0x44);
      pIVar4 = CComponent::Client((CComponent *)0x1684b1);
      iVar2 = IClient::GameTick(pIVar4);
      clamp<int>(in_stack_fffffffffffffea4 - iVar2,0,iVar1 / 1000);
      RenderNinjaBar((CHud *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    else {
      CComponent::RenderTools((CComponent *)0x168511);
      in_stack_fffffffffffffe98 = (g_pData->m_Weapons).m_aId;
      CRenderTools::SelectSprite
                ((CRenderTools *)this_01,pSpr,(int)((ulong)this_00 >> 0x20),(int)this_00,
                 in_stack_fffffffffffffea4);
      if (*(int *)(in_RSI + 0x48) == 3) {
        local_12c = 0;
        while (in_stack_fffffffffffffe94 = local_12c,
              iVar1 = minimum<int>(*(int *)(in_RSI + 0x44),10),
              (int)in_stack_fffffffffffffe94 < iVar1) {
          IGraphics::CQuadItem::CQuadItem
                    ((CQuadItem *)&local_bc,(float)(int)(local_12c * 0xc) + 6.0,29.0,10.0,10.0);
          (&local_a8[0].m_pName)[(long)(int)local_12c * 2] = local_bc;
          (&local_a8[0].m_pSet)[(long)(int)local_12c * 2] = local_b4;
          local_12c = local_12c + 1;
        }
      }
      else {
        local_12c = 0;
        while (in_stack_fffffffffffffe90 = local_12c,
              iVar1 = minimum<int>(*(int *)(in_RSI + 0x44),10),
              (int)in_stack_fffffffffffffe90 < iVar1) {
          IGraphics::CQuadItem::CQuadItem
                    ((CQuadItem *)&local_cc,(float)(int)(local_12c * 0xc) + 5.0,29.0,12.0,12.0);
          (&local_a8[0].m_pName)[(long)(int)local_12c * 2] = local_cc;
          (&local_a8[0].m_pSet)[(long)(int)local_12c * 2] = local_c4;
          local_12c = local_12c + 1;
        }
      }
      pIVar3 = CComponent::Graphics((CComponent *)0x1686c3);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,local_a8,(ulong)local_12c);
    }
    local_138 = 0;
    CComponent::RenderTools((CComponent *)0x1686ed);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    for (; iVar1 = minimum<int>(*(int *)(in_RSI + 0x3c),10), (int)local_138 < iVar1;
        local_138 = local_138 + 1) {
      IGraphics::CQuadItem::CQuadItem
                ((CQuadItem *)&stack0xffffffffffffff24,(float)(int)(local_138 * 0xc) + 5.0,5.0,12.0,
                 12.0);
      (&local_a8[0].m_pName)[(long)(int)local_138 * 2] =
           (char *)CONCAT44(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      (&local_a8[0].m_pSet)[(long)(int)local_138 * 2] =
           (CDataSpriteset *)CONCAT44(fStack_d0,in_stack_ffffffffffffff2c);
    }
    pIVar3 = CComponent::Graphics((CComponent *)0x16879d);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,local_a8,(ulong)local_138);
    local_12c = 0;
    CComponent::RenderTools((CComponent *)0x1687c7);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    for (; (int)local_138 < 10; local_138 = local_138 + 1) {
      IGraphics::CQuadItem::CQuadItem
                ((CQuadItem *)&local_ec,(float)(int)(local_138 * 0xc) + 5.0,5.0,12.0,12.0);
      (&local_a8[0].m_pName)[(long)(int)local_12c * 2] = local_ec;
      (&local_a8[0].m_pSet)[(long)(int)local_12c * 2] =
           (CDataSpriteset *)CONCAT44(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      local_12c = local_12c + 1;
    }
    pIVar3 = CComponent::Graphics((CComponent *)0x168862);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,local_a8,(ulong)local_12c);
    local_138 = 0;
    CComponent::RenderTools((CComponent *)0x16888c);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    for (; iVar1 = minimum<int>(*(int *)(in_RSI + 0x40),10), (int)local_138 < iVar1;
        local_138 = local_138 + 1) {
      IGraphics::CQuadItem::CQuadItem
                ((CQuadItem *)&local_fc,(float)(int)(local_138 * 0xc) + 5.0,17.0,12.0,12.0);
      (&local_a8[0].m_pName)[(long)(int)local_138 * 2] = local_fc;
      (&local_a8[0].m_pSet)[(long)(int)local_138 * 2] = local_f4;
    }
    pIVar3 = CComponent::Graphics((CComponent *)0x16893c);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,local_a8,(ulong)local_138);
    local_12c = 0;
    CComponent::RenderTools((CComponent *)0x168966);
    CRenderTools::SelectSprite
              ((CRenderTools *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
    for (; (int)local_138 < 10; local_138 = local_138 + 1) {
      IGraphics::CQuadItem::CQuadItem
                ((CQuadItem *)&local_10c,(float)(int)(local_138 * 0xc) + 5.0,17.0,12.0,12.0);
      (&local_a8[0].m_pName)[(long)(int)local_12c * 2] = local_10c;
      (&local_a8[0].m_pSet)[(long)(int)local_12c * 2] = local_104;
      local_12c = local_12c + 1;
    }
    pIVar3 = CComponent::Graphics((CComponent *)0x168a00);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,local_a8,(ulong)local_12c);
    pIVar3 = CComponent::Graphics((CComponent *)0x168a22);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
    pIVar3 = CComponent::Graphics((CComponent *)0x168a38);
    (*(pIVar3->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderHealthAndAmmo(const CNetObj_Character *pCharacter)
{
	if(!pCharacter)
		return;

	float x = 5;
	float y = 5;
	int i;
	IGraphics::CQuadItem Array[10];

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->WrapClamp();

	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);

	// render ammo
	if(pCharacter->m_Weapon == WEAPON_NINJA)
	{
		const int Max = g_pData->m_Weapons.m_Ninja.m_Duration * Client()->GameTickSpeed() / 1000;
		float NinjaProgress = clamp(pCharacter->m_AmmoCount-Client()->GameTick(), 0, Max) / (float)Max;
		RenderNinjaBar(x, y+24.f, NinjaProgress);
	}
	else
	{
		RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[pCharacter->m_Weapon%NUM_WEAPONS].m_pSpriteProj);
		if(pCharacter->m_Weapon == WEAPON_GRENADE)
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+1+i*12, y+24, 10, 10);
		}
		else
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+i*12, y+24, 12, 12);
		}
		Graphics()->QuadsDrawTL(Array, i);
	}

	int h = 0;

	// render health
	RenderTools()->SelectSprite(SPRITE_HEALTH_FULL);
	for(; h < minimum(pCharacter->m_Health, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_HEALTH_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, i);

	// render armor meter
	h = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_FULL);
	for(; h < minimum(pCharacter->m_Armor, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, i);
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}